

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O1

uint RemSP::Merge(uint i,uint j)

{
  uint *puVar1;
  uint uVar2;
  uint root_j;
  uint *puVar3;
  uint uVar4;
  uint *puVar5;
  bool bVar6;
  
  puVar1 = P_;
  uVar2 = P_[i];
  uVar4 = P_[j];
  if (uVar2 == uVar4) {
    return uVar2;
  }
  puVar3 = P_ + i;
  puVar5 = P_ + j;
  do {
    if (uVar4 < uVar2) {
      *puVar3 = uVar4;
      bVar6 = i == uVar2;
      i = uVar2;
      if (bVar6) {
        return uVar4;
      }
    }
    else {
      *puVar5 = uVar2;
      bVar6 = j == uVar4;
      j = uVar4;
      if (bVar6) {
        return *puVar3;
      }
    }
    puVar3 = puVar1 + i;
    uVar2 = *puVar3;
    puVar5 = puVar1 + j;
    uVar4 = *puVar5;
  } while (uVar2 != uVar4);
  return uVar2;
}

Assistant:

static unsigned Merge(unsigned i, unsigned j)
    {
        unsigned root_i(i), root_j(j);

        while (P_[root_i] != P_[root_j]) {
            if (P_[root_i] > P_[root_j]) {
                if (root_i == P_[root_i]) {
                    P_[root_i] = P_[root_j];
                    return P_[root_i];
                }
                unsigned z = P_[root_i];
                P_[root_i] = P_[root_j];
                root_i = z;
            }
            else {
                if (root_j == P_[root_j]) {
                    P_[root_j] = P_[root_i];
                    return P_[root_i];
                }
                unsigned z = P_[root_j];
                P_[root_j] = P_[root_i];
                root_j = z;
            }
        }
        return P_[root_i];
    }